

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::EntryUnshift(RecyclableObject *function,CallInfo callInfo,...)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  CallFlags e;
  ScriptContext *pSVar5;
  ThreadContext *pTVar6;
  Var *values;
  undefined4 *puVar7;
  Var pvVar8;
  JavascriptLibrary *this;
  JavascriptArray *pJVar9;
  SparseArraySegmentBase *pSVar10;
  SparseArraySegmentBase **ppSVar11;
  byte local_14a;
  byte local_149;
  SparseArraySegmentBase *local_d0;
  SparseArraySegmentBase *renumberSeg;
  undefined1 local_c0 [6];
  bool isFloatArray;
  bool isIntArray;
  uint local_ac;
  byte local_a5;
  uint32 maxLen;
  bool newLenOverflowed;
  uint32 length;
  bool useNoSideEffectUnshift;
  JavascriptArray *pJStack_98;
  uint32 unshiftElements;
  JavascriptArray *pArr;
  CallInfo local_88;
  Var res;
  undefined1 local_70 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  pTVar6 = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar6,0xc00,pSVar5,(PVOID)0x0);
  iVar4 = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,iVar4);
  args.super_Arguments.Values = (Type)function_local;
  bVar3 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1f5d,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  jsReentLock._24_8_ = RecyclableObject::GetScriptContext(function);
  pTVar6 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
  JsReentLock::JsReentLock((JsReentLock *)local_70,pTVar6);
  pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,0);
  JsReentLock::setObjectForMutation((JsReentLock *)local_70,pvVar8);
  e = Js::operator&((uint)function_local._3_1_,CallFlags_New);
  bVar3 = operator!(e);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1f62,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  this = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
  local_88 = (CallInfo)JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
  callInfo_local = local_88;
  if (((ulong)scriptContext & 0xffffff) != 0) {
    pJStack_98 = (JavascriptArray *)0x0;
    pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,0);
    bVar3 = IsNonES5Array(pvVar8);
    if (bVar3) {
      pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,0);
      pJVar9 = VarTo<Js::JavascriptArray>(pvVar8);
      iVar4 = (*(pJVar9->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x66])();
      if (iVar4 == 0) {
        pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,0);
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(pvVar8);
        pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,0);
        pJStack_98 = VarTo<Js::JavascriptArray>(pvVar8);
      }
    }
    length = ((uint)scriptContext & 0xffffff) - 1;
    local_149 = 0;
    if (pJStack_98 != (JavascriptArray *)0x0) {
      local_14a = 1;
      if (length != 0) {
        bVar3 = HasAnyES5ArrayInPrototypeChain(pJStack_98,true);
        local_14a = bVar3 ^ 0xff;
      }
      local_149 = local_14a;
    }
    newLenOverflowed = (bool)(local_149 & 1);
    if (newLenOverflowed == false) {
      JsReentLock::unlock((JsReentLock *)local_70);
      local_88 = (CallInfo)
                 UnshiftObjectHelper((Arguments *)&scriptContext,(ScriptContext *)jsReentLock._24_8_
                                    );
    }
    else {
      if (length != 0) {
        maxLen = (pJStack_98->super_ArrayObject).length;
        bVar3 = IsFillFromPrototypes(pJStack_98);
        if (bVar3) {
          FillFromPrototypes(pJStack_98,0,(pJStack_98->super_ArrayObject).length);
        }
        if (maxLen != (pJStack_98->super_ArrayObject).length) {
          Throw::FatalInternalError(-0x7fffbffb);
        }
        local_a5 = 0;
        local_ac = -length - 1;
        if (local_ac < (pJStack_98->super_ArrayObject).length) {
          local_a5 = 1;
          EnsureNonNativeArray(pJStack_98);
          JsReentLock::unlock((JsReentLock *)local_70);
          pJVar9 = pJStack_98;
          BigIndex::BigIndex((BigIndex *)local_c0,0xffffffff);
          TruncateToProperties(pJVar9,(BigIndex *)local_c0,local_ac);
          JsReentLock::MutateArrayObject((JsReentLock *)local_70);
          JsReentLock::relock((JsReentLock *)local_70);
          if ((pJStack_98->super_ArrayObject).length + length != -1) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0x1f93,"(pArr->length + unshiftElements == MaxArrayLength)"
                                        ,"pArr->length + unshiftElements == MaxArrayLength");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          bVar3 = VarIs<Js::ES5Array,Js::JavascriptArray>(pJStack_98);
          if (bVar3) {
            JsReentLock::unlock((JsReentLock *)local_70);
            callInfo_local =
                 (CallInfo)
                 UnshiftObjectHelper((Arguments *)&scriptContext,(ScriptContext *)jsReentLock._24_8_
                                    );
            goto LAB_010d79ee;
          }
        }
        ClearSegmentMap(pJStack_98);
        if (-length - 1 < (pJStack_98->super_ArrayObject).length) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x1f9c,"(pArr->length <= MaxArrayLength - unshiftElements)",
                                      "pArr->length <= MaxArrayLength - unshiftElements");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        renumberSeg._6_1_ = false;
        bVar3 = VarIs<Js::JavascriptNativeIntArray,Js::JavascriptArray>(pJStack_98);
        if (!bVar3) {
          renumberSeg._6_1_ = VarIs<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(pJStack_98);
        }
        pSVar10 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pJStack_98->head)
        ;
        uVar1 = pSVar10->size;
        pSVar10 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pJStack_98->head)
        ;
        if (uVar1 < pSVar10->length + length) {
          if (bVar3) {
            GrowArrayHeadHelperForUnshift<int>
                      (pJStack_98,length,(ScriptContext *)jsReentLock._24_8_);
          }
          else if (renumberSeg._6_1_ == false) {
            GrowArrayHeadHelperForUnshift<void*>
                      (pJStack_98,length,(ScriptContext *)jsReentLock._24_8_);
          }
          else {
            GrowArrayHeadHelperForUnshift<double>
                      (pJStack_98,length,(ScriptContext *)jsReentLock._24_8_);
          }
        }
        pSVar10 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pJStack_98->head)
        ;
        ppSVar11 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                             ((WriteBarrierPtr *)&pSVar10->next);
        local_d0 = *ppSVar11;
        while (local_d0 != (SparseArraySegmentBase *)0x0) {
          local_d0->left = local_d0->left + length;
          ppSVar11 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                               ((WriteBarrierPtr *)&local_d0->next);
          if (*ppSVar11 == (SparseArraySegmentBase *)0x0) {
            SparseArraySegmentBase::EnsureSizeInBound(local_d0);
          }
          ppSVar11 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                               ((WriteBarrierPtr *)&local_d0->next);
          local_d0 = *ppSVar11;
        }
        if (bVar3) {
          UnshiftHelper<int>(pJStack_98,length,(Var *)args.super_Arguments.Info);
        }
        else if (renumberSeg._6_1_ == false) {
          UnshiftHelper<void*>(pJStack_98,length,(Var *)args.super_Arguments.Info);
        }
        else {
          UnshiftHelper<double>(pJStack_98,length,(Var *)args.super_Arguments.Info);
        }
        InvalidateLastUsedSegment(pJStack_98);
        (pJStack_98->super_ArrayObject).length = (pJStack_98->super_ArrayObject).length + length;
        ClearSegmentMap(pJStack_98);
        (*(pJStack_98->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])()
        ;
        if ((local_a5 & 1) != 0) {
          JavascriptError::ThrowRangeError
                    ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec5a,(PCWSTR)0x0);
        }
      }
      local_88 = (CallInfo)
                 JavascriptNumber::ToVar
                           ((pJStack_98->super_ArrayObject).length,
                            (ScriptContext *)jsReentLock._24_8_);
    }
    callInfo_local = local_88;
  }
LAB_010d79ee:
  pArr._4_4_ = 1;
  JsReentLock::~JsReentLock((JsReentLock *)local_70);
  return (Var)callInfo_local;
}

Assistant:

Var JavascriptArray::EntryUnshift(RecyclableObject* function, CallInfo callInfo, ...)
    {
        JIT_HELPER_REENTRANT_HEADER(Array_Unshift);
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, args[0]);

        Assert(!(callInfo.Flags & CallFlags_New));

        Var res = scriptContext->GetLibrary()->GetUndefined();

        if (args.Info.Count == 0)
        {
           return res;
        }

        JavascriptArray * pArr = nullptr;
        if (JavascriptArray::IsNonES5Array(args[0])
            && !VarTo<JavascriptArray>(args[0])->IsCrossSiteObject())
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(args[0]);
#endif
            pArr = VarTo<JavascriptArray>(args[0]);
        }

        uint32 unshiftElements = args.Info.Count - 1;

        // forceCheckProtoChain - since the array expand to accommodate new items thus we have to check if we have accessor on the proto chain.
        bool useNoSideEffectUnshift = pArr != nullptr && (unshiftElements == 0 || !HasAnyES5ArrayInPrototypeChain(pArr, true /*forceCheckProtoChain*/));

        if (useNoSideEffectUnshift)
        {
            if (unshiftElements > 0)
            {
                uint32 length = pArr->length;
                if (pArr->IsFillFromPrototypes())
                {
                    pArr->FillFromPrototypes(0, pArr->length); // We need find all missing value from [[proto]] object
                }

                // As we have already established that the FillFromPrototype should not change the bound of the array.
                if (length != pArr->length)
                {
                    Js::Throw::FatalInternalError();
                }

                // Pre-process: truncate overflowing elements to properties
                bool newLenOverflowed = false;
                uint32 maxLen = MaxArrayLength - unshiftElements;
                if (pArr->length > maxLen)
                {
                    newLenOverflowed = true;
                    // Ensure the array is non-native when overflow happens
                    EnsureNonNativeArray(pArr);
                    JS_REENTRANT(jsReentLock, pArr->TruncateToProperties(MaxArrayLength, maxLen));
                    Assert(pArr->length + unshiftElements == MaxArrayLength);
                    if (VarIs<ES5Array>(pArr))
                    {
                        JS_REENTRANT_UNLOCK(jsReentLock, return UnshiftObjectHelper(args, scriptContext));
                    }
                }

                pArr->ClearSegmentMap(); // Dump segmentMap on unshift (before any possible allocation and throw)

                Assert(pArr->length <= MaxArrayLength - unshiftElements);
                bool isIntArray = false;
                bool isFloatArray = false;

                if (VarIs<JavascriptNativeIntArray>(pArr))
                {
                    isIntArray = true;
                }
                else if (VarIs<JavascriptNativeFloatArray>(pArr))
                {
                    isFloatArray = true;
                }

                // If we need to grow head segment and there is already a next segment, then allocate the new head segment upfront
                // If there is OOM in array allocation, then array consistency is maintained.
                if (pArr->head->size < pArr->head->length + unshiftElements)
                {
                    if (isIntArray)
                    {
                        GrowArrayHeadHelperForUnshift<int32>(pArr, unshiftElements, scriptContext);
                    }
                    else if (isFloatArray)
                    {
                        GrowArrayHeadHelperForUnshift<double>(pArr, unshiftElements, scriptContext);
                    }
                    else
                    {
                        GrowArrayHeadHelperForUnshift<Var>(pArr, unshiftElements, scriptContext);
                    }
                }

                SparseArraySegmentBase* renumberSeg = pArr->head->next;

                while (renumberSeg)
                {
                    renumberSeg->left += unshiftElements;
                    if (renumberSeg->next == nullptr)
                    {
                        // last segment can shift its left + size beyond MaxArrayLength, so truncate if so
                        renumberSeg->EnsureSizeInBound();
                    }
                    renumberSeg = renumberSeg->next;
                }

                try
                {
                    if (isIntArray)
                    {
                        UnshiftHelper<int32>(pArr, unshiftElements, args.Values);
                    }
                    else if (isFloatArray)
                    {
                        UnshiftHelper<double>(pArr, unshiftElements, args.Values);
                    }
                    else
                    {
                        UnshiftHelper<Var>(pArr, unshiftElements, args.Values);
                    }
                }
                catch (...)
                {
                    Js::Throw::FatalInternalError();
                }

                pArr->InvalidateLastUsedSegment();
                pArr->length += unshiftElements;
                pArr->ClearSegmentMap();

#ifdef VALIDATE_ARRAY
                pArr->ValidateArray();
#endif

                if (newLenOverflowed) // ES5: throw if new "length" exceeds max array length
                {
                    JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthAssignIncorrect);
                }
            }
            res = JavascriptNumber::ToVar(pArr->length, scriptContext);
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, res = UnshiftObjectHelper(args, scriptContext));
        }
        return res;
        JIT_HELPER_END(Array_Unshift);
    }